

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O0

aiNode * __thiscall
Assimp::Q3BSPFileImporter::CreateTopology
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,uint materialIdx,
          vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *rArray,
          aiMesh **pMesh)

{
  sQ3BSPFace *pQ3BSPFace_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  size_t sVar7;
  size_t sVar8;
  aiMesh *this_00;
  ulong uVar9;
  size_t *psVar10;
  aiVector3D *paVar11;
  reference ppsVar12;
  uint *puVar13;
  aiFace *paVar14;
  ulong uVar15;
  aiVector3t<float> *local_160;
  aiVector3t<float> *local_138;
  aiVector3t<float> *local_110;
  aiVector3t<float> *local_e8;
  aiFace *local_c0;
  aiNode *pNode;
  sQ3BSPFace *pQ3BSPFace;
  __normal_iterator<Assimp::Q3BSP::sQ3BSPFace_**,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_>
  local_70;
  __normal_iterator<Assimp::Q3BSP::sQ3BSPFace_*const_*,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_>
  local_68;
  const_iterator it;
  uint vertIdx;
  uint faceIdx;
  size_t numTriangles;
  aiMesh *mesh;
  size_t numFaces;
  size_t numVerts;
  aiMesh **pMesh_local;
  vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *rArray_local;
  uint materialIdx_local;
  Q3BSPModel *pModel_local;
  Q3BSPFileImporter *this_local;
  
  sVar7 = countData(this,rArray);
  if (sVar7 == 0) {
    this_local = (Q3BSPFileImporter *)0x0;
  }
  else {
    sVar8 = countFaces(this,rArray);
    if (sVar8 == 0) {
      this_local = (Q3BSPFileImporter *)0x0;
    }
    else {
      this_00 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_00);
      sVar8 = countTriangles(this,rArray);
      this_00->mPrimitiveTypes = 4;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = sVar8;
      uVar9 = SUB168(auVar1 * ZEXT816(0x10),0);
      uVar15 = uVar9 + 8;
      if (SUB168(auVar1 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar9) {
        uVar15 = 0xffffffffffffffff;
      }
      psVar10 = (size_t *)operator_new__(uVar15);
      *psVar10 = sVar8;
      paVar14 = (aiFace *)(psVar10 + 1);
      if (sVar8 != 0) {
        local_c0 = paVar14;
        do {
          aiFace::aiFace(local_c0);
          local_c0 = local_c0 + 1;
        } while (local_c0 != paVar14 + sVar8);
      }
      this_00->mFaces = paVar14;
      this_00->mNumFaces = (uint)sVar8;
      this_00->mNumVertices = (uint)sVar7;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = sVar7;
      uVar9 = SUB168(auVar2 * ZEXT816(0xc),0);
      if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      paVar11 = (aiVector3D *)operator_new__(uVar9);
      if (sVar7 != 0) {
        local_e8 = paVar11;
        do {
          aiVector3t<float>::aiVector3t(local_e8);
          local_e8 = local_e8 + 1;
        } while (local_e8 != paVar11 + sVar7);
      }
      this_00->mVertices = paVar11;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = sVar7;
      uVar9 = SUB168(auVar3 * ZEXT816(0xc),0);
      if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      paVar11 = (aiVector3D *)operator_new__(uVar9);
      if (sVar7 != 0) {
        local_110 = paVar11;
        do {
          aiVector3t<float>::aiVector3t(local_110);
          local_110 = local_110 + 1;
        } while (local_110 != paVar11 + sVar7);
      }
      this_00->mNormals = paVar11;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = sVar7;
      uVar9 = SUB168(auVar4 * ZEXT816(0xc),0);
      if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      paVar11 = (aiVector3D *)operator_new__(uVar9);
      if (sVar7 != 0) {
        local_138 = paVar11;
        do {
          aiVector3t<float>::aiVector3t(local_138);
          local_138 = local_138 + 1;
        } while (local_138 != paVar11 + sVar7);
      }
      this_00->mTextureCoords[0] = paVar11;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = sVar7;
      uVar9 = SUB168(auVar5 * ZEXT816(0xc),0);
      if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      paVar11 = (aiVector3D *)operator_new__(uVar9);
      if (sVar7 != 0) {
        local_160 = paVar11;
        do {
          aiVector3t<float>::aiVector3t(local_160);
          local_160 = local_160 + 1;
        } while (local_160 != paVar11 + sVar7);
      }
      this_00->mTextureCoords[1] = paVar11;
      this_00->mMaterialIndex = materialIdx;
      it._M_current._4_4_ = 0;
      it._M_current._0_4_ = 0;
      this_00->mNumUVComponents[0] = 2;
      this_00->mNumUVComponents[1] = 2;
      local_70._M_current =
           (sQ3BSPFace **)
           std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>::
           begin(rArray);
      __gnu_cxx::
      __normal_iterator<Assimp::Q3BSP::sQ3BSPFace*const*,std::vector<Assimp::Q3BSP::sQ3BSPFace*,std::allocator<Assimp::Q3BSP::sQ3BSPFace*>>>
      ::__normal_iterator<Assimp::Q3BSP::sQ3BSPFace**>
                ((__normal_iterator<Assimp::Q3BSP::sQ3BSPFace*const*,std::vector<Assimp::Q3BSP::sQ3BSPFace*,std::allocator<Assimp::Q3BSP::sQ3BSPFace*>>>
                  *)&local_68,&local_70);
      while( true ) {
        pQ3BSPFace = (sQ3BSPFace *)
                     std::
                     vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                     ::end(rArray);
        bVar6 = __gnu_cxx::operator!=
                          (&local_68,
                           (__normal_iterator<Assimp::Q3BSP::sQ3BSPFace_**,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_>
                            *)&pQ3BSPFace);
        if (!bVar6) break;
        ppsVar12 = __gnu_cxx::
                   __normal_iterator<Assimp::Q3BSP::sQ3BSPFace_*const_*,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_>
                   ::operator*(&local_68);
        pQ3BSPFace_00 = *ppsVar12;
        if (pQ3BSPFace_00 == (sQ3BSPFace *)0x0) {
          __assert_fail("__null != pQ3BSPFace",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                        ,0x160,
                        "aiNode *Assimp::Q3BSPFileImporter::CreateTopology(const Q3BSP::Q3BSPModel *, unsigned int, std::vector<sQ3BSPFace *> &, aiMesh **)"
                       );
        }
        if (((pQ3BSPFace_00 != (sQ3BSPFace *)0x0) && (0 < pQ3BSPFace_00->iNumOfFaceVerts)) &&
           ((pQ3BSPFace_00->iType == 1 || (pQ3BSPFace_00->iType == 3)))) {
          createTriangleTopology
                    (this,pModel,pQ3BSPFace_00,this_00,(uint *)((long)&it._M_current + 4),
                     (uint *)&it);
        }
        __gnu_cxx::
        __normal_iterator<Assimp::Q3BSP::sQ3BSPFace_*const_*,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_>
        ::operator++(&local_68);
      }
      this_local = (Q3BSPFileImporter *)operator_new(0x478);
      aiNode::aiNode((aiNode *)this_local);
      ((aiNode *)this_local)->mNumMeshes = 1;
      puVar13 = (uint *)operator_new__(4);
      ((aiNode *)this_local)->mMeshes = puVar13;
      *pMesh = this_00;
    }
  }
  return (aiNode *)this_local;
}

Assistant:

aiNode *Q3BSPFileImporter::CreateTopology( const Q3BSP::Q3BSPModel *pModel, unsigned int materialIdx,
        std::vector<sQ3BSPFace*> &rArray, aiMesh **pMesh ) {
    size_t numVerts = countData( rArray );
    if ( 0 == numVerts ) {
        return nullptr;
    }

    size_t numFaces = countFaces( rArray );
    if ( 0 == numFaces ) {
        return nullptr;
    }

    aiMesh *mesh = new aiMesh;
    size_t numTriangles = countTriangles( rArray );
    mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    mesh->mFaces = new aiFace[ numTriangles ];
    mesh->mNumFaces = static_cast<unsigned int>(numTriangles);

    mesh->mNumVertices = static_cast<unsigned int>(numVerts);
    mesh->mVertices = new aiVector3D[ numVerts ];
    mesh->mNormals =  new aiVector3D[ numVerts ];
    mesh->mTextureCoords[ 0 ] = new aiVector3D[ numVerts ];
    mesh->mTextureCoords[ 1 ] = new aiVector3D[ numVerts ];
    mesh->mMaterialIndex = materialIdx;

    unsigned int faceIdx = 0;
    unsigned int vertIdx = 0;
    mesh->mNumUVComponents[ 0 ] = 2;
    mesh->mNumUVComponents[ 1 ] = 2;
    for ( std::vector<sQ3BSPFace*>::const_iterator it = rArray.begin(); it != rArray.end(); ++it ) {
        Q3BSP::sQ3BSPFace *pQ3BSPFace = *it;
        ai_assert( NULL != pQ3BSPFace );
        if ( nullptr == pQ3BSPFace ) {
            continue;
        }

        if ( pQ3BSPFace->iNumOfFaceVerts > 0 ) {
            if ( pQ3BSPFace->iType == Polygon || pQ3BSPFace->iType == TriangleMesh ) {
                createTriangleTopology( pModel, pQ3BSPFace, mesh, faceIdx, vertIdx );
            }
        }
    }

    aiNode *pNode = new aiNode;
    pNode->mNumMeshes = 1;
    pNode->mMeshes = new unsigned int[ 1 ];
    *pMesh = mesh;

    return pNode;
}